

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O1

void bcm2835_spi_writenb(char *tbuf,uint32_t len)

{
  uint32_t *puVar1;
  uint32_t *paddr;
  byte bVar2;
  ulong uVar3;
  
  paddr = bcm2835_spi0;
  puVar1 = bcm2835_spi0 + 1;
  bcm2835_peri_set_bits(bcm2835_spi0,0x30,0x30);
  bcm2835_peri_set_bits(paddr,0x80,0x80);
  if (len != 0) {
    uVar3 = 0;
    do {
      do {
        while (debug != '\0') {
          printf("bcm2835_peri_read  paddr %p\n");
        }
      } while ((*paddr >> 0x12 & 1) == 0);
      bVar2 = tbuf[uVar3];
      if (bcm2835_spi_bit_order == '\0') {
        bVar2 = ""[bVar2];
      }
      *puVar1 = (uint)bVar2;
      do {
        if (debug != '\0') {
          printf("bcm2835_peri_read  paddr %p\n");
          break;
        }
      } while ((*paddr >> 0x11 & 1) != 0);
      uVar3 = uVar3 + 1;
    } while (uVar3 != len);
  }
  do {
    if (debug == '\0') {
      if ((*paddr >> 0x10 & 1) != 0) {
        bcm2835_peri_set_bits(paddr,0,0x80);
        return;
      }
    }
    else {
      printf("bcm2835_peri_read_nb  paddr %p\n");
    }
    do {
      if (debug != '\0') {
        printf("bcm2835_peri_read  paddr %p\n");
        break;
      }
    } while ((*paddr >> 0x11 & 1) != 0);
  } while( true );
}

Assistant:

void bcm2835_spi_writenb(const char* tbuf, uint32_t len)
{
    volatile uint32_t* paddr = bcm2835_spi0 + BCM2835_SPI0_CS/4;
    volatile uint32_t* fifo = bcm2835_spi0 + BCM2835_SPI0_FIFO/4;
    uint32_t i;

    /* This is Polled transfer as per section 10.6.1
    // BUG ALERT: what happens if we get interupted in this section, and someone else
    // accesses a different peripheral?
    // Answer: an ISR is required to issue the required memory barriers.
    */

    /* Clear TX and RX fifos */
    bcm2835_peri_set_bits(paddr, BCM2835_SPI0_CS_CLEAR, BCM2835_SPI0_CS_CLEAR);

    /* Set TA = 1 */
    bcm2835_peri_set_bits(paddr, BCM2835_SPI0_CS_TA, BCM2835_SPI0_CS_TA);

    for (i = 0; i < len; i++)
    {
	/* Maybe wait for TXD */
	while (!(bcm2835_peri_read(paddr) & BCM2835_SPI0_CS_TXD))
	    ;
	
	/* Write to FIFO, no barrier */
	bcm2835_peri_write_nb(fifo, bcm2835_correct_order(tbuf[i]));
	
	/* Read from FIFO to prevent stalling */
	while (bcm2835_peri_read(paddr) & BCM2835_SPI0_CS_RXD)
	    (void) bcm2835_peri_read_nb(fifo);
    }
    
    /* Wait for DONE to be set */
    while (!(bcm2835_peri_read_nb(paddr) & BCM2835_SPI0_CS_DONE)) {
	while (bcm2835_peri_read(paddr) & BCM2835_SPI0_CS_RXD)
		(void) bcm2835_peri_read_nb(fifo);
    };

    /* Set TA = 0, and also set the barrier */
    bcm2835_peri_set_bits(paddr, 0, BCM2835_SPI0_CS_TA);
}